

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  undefined8 uStack_38;
  
  lVar2 = 0;
  uStack_38 = in_RAX;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tab[",4);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]: ",3);
    uStack_38 = CONCAT17("Napis"[lVar2],(undefined7)uStack_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(char *)((long)&uStack_38 + 7),1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return 0;
}

Assistant:

int main() {
    
    char tab[]="Napis";

    int i = 0;
    while(tab[i] != '\0') {
        cout << "tab[" << i << "]: " << tab[i] << endl;
        i++;
    }

    return 0;
}